

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  size_t *psVar1;
  BYTE *src;
  uint uVar2;
  ZSTD_dStage ZVar3;
  ulong uVar4;
  ZSTD_freeFunction p_Var5;
  ZSTD_allocFunction p_Var6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ZSTD_dStreamStage ZVar10;
  ZSTD_nextInputType_e ZVar11;
  ZSTD_DDict *pZVar12;
  char *pcVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  size_t sVar18;
  void *pvVar19;
  void *src_00;
  void *__src;
  void *pvVar20;
  void *pvVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ZSTD_frameSizeInfo ZVar25;
  size_t local_a0;
  void *local_88;
  
  uVar17 = input->pos;
  uVar4 = input->size;
  if (uVar4 < uVar17) {
    local_a0 = 0xffffffffffffffb8;
  }
  else {
    if (output->pos <= output->size) {
      src_00 = (void *)(uVar17 + (long)input->src);
      pvVar21 = (void *)(uVar4 + (long)input->src);
      pvVar19 = (void *)(output->pos + (long)output->dst);
      pvVar20 = (void *)(output->size + (long)output->dst);
      psVar1 = &zds->outStart;
      src = zds->headerBuffer;
      __src = src_00;
      local_88 = pvVar19;
LAB_00163de6:
      bVar8 = true;
      switch(zds->streamStage) {
      case zdss_init:
        goto switchD_00163e09_caseD_0;
      case zdss_loadHeader:
        goto switchD_00163e09_caseD_1;
      case zdss_read:
        goto switchD_00163e09_caseD_2;
      case zdss_load:
        bVar8 = true;
        goto LAB_0016436a;
      case zdss_flush:
        goto LAB_001644e4;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x6080,
                      "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                     );
      }
    }
    local_a0 = 0xffffffffffffffba;
  }
  return local_a0;
switchD_00163e09_caseD_0:
  zds->streamStage = zdss_loadHeader;
  zds->inPos = 0;
  zds->legacyVersion = 0;
  zds->hostageByte = 0;
  zds->lhSize = 0;
  *psVar1 = 0;
  zds->outEnd = 0;
switchD_00163e09_caseD_1:
  sVar16 = ZSTD_getFrameHeader_advanced(&zds->fParams,src,zds->lhSize,zds->format);
  if (sVar16 < 0xffffffffffffff89) {
    if (sVar16 == 0) {
      iVar9 = 0;
    }
    else {
      uVar14 = (long)pvVar21 - (long)__src;
      if (pvVar21 < __src) {
        __assert_fail("iend >= ip",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x5fdc,
                      "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                     );
      }
      sVar18 = zds->lhSize;
      uVar22 = sVar16 - sVar18;
      if (uVar14 < uVar22) {
        if (pvVar21 != __src) {
          memcpy(src + sVar18,__src,uVar14);
          zds->lhSize = zds->lhSize + uVar14;
        }
        input->pos = input->size;
        uVar14 = (ulong)(zds->format == ZSTD_f_zstd1) * 4 + 2;
        if (sVar16 < uVar14) {
          sVar16 = uVar14;
        }
        iVar9 = 1;
        local_a0 = (sVar16 - zds->lhSize) + 3;
      }
      else {
        if (__src == (void *)0x0) {
          __assert_fail("ip != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5fe5,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        memcpy(src + sVar18,__src,uVar22);
        zds->lhSize = sVar16;
        __src = (void *)((long)__src + uVar22);
        iVar9 = 4;
      }
    }
  }
  else {
    iVar9 = 1;
    local_a0 = sVar16;
  }
  bVar8 = true;
  if (iVar9 != 4) {
    if (iVar9 != 0) {
      return local_a0;
    }
    uVar14 = (zds->fParams).frameContentSize;
    bVar8 = true;
    if (((uVar14 != 0) && ((zds->fParams).windowSize != 0)) &&
       (uVar14 <= (ulong)((long)pvVar20 - (long)local_88))) {
      ZVar25 = ZSTD_findFrameSizeInfo(src_00,uVar4 - uVar17);
      uVar14 = ZVar25.compressedSize;
      if (uVar4 - uVar17 < uVar14) {
        iVar9 = 0;
LAB_00164039:
        bVar8 = true;
      }
      else {
        pZVar12 = ZSTD_getDDict(zds);
        sVar16 = ZSTD_decompressMultiFrame
                           (zds,local_88,(long)pvVar20 - (long)local_88,src_00,uVar14,(void *)0x0,0,
                            pZVar12);
        if (0xffffffffffffff88 < sVar16) {
          iVar9 = 1;
          local_a0 = sVar16;
          goto LAB_00164039;
        }
        __src = (void *)(uVar14 + (long)src_00);
        local_88 = (void *)((long)local_88 + sVar16);
        zds->expected = 0;
        zds->streamStage = zdss_init;
        bVar8 = false;
        iVar9 = 4;
      }
      if (iVar9 == 4) goto LAB_0016458e;
      if (iVar9 != 0) {
        return local_a0;
      }
    }
    pZVar12 = ZSTD_getDDict(zds);
    ZSTD_decompressBegin_usingDDict(zds,pZVar12);
    if ((*(uint *)zds->headerBuffer & 0xfffffff0) == 0x184d2a50) {
      zds->expected = (ulong)*(uint *)(zds->headerBuffer + 4);
      zds->stage = ZSTDds_skipFrame;
    }
    else {
      sVar16 = ZSTD_decodeFrameHeader(zds,src,zds->lhSize);
      if (0xffffffffffffff88 < sVar16) {
        return sVar16;
      }
      zds->expected = 3;
      zds->stage = ZSTDds_decodeBlockHeader;
    }
    uVar14 = (zds->fParams).windowSize;
    if (uVar14 < 0x401) {
      uVar14 = 0x400;
    }
    (zds->fParams).windowSize = uVar14;
    if (zds->maxWindowSize < uVar14) {
      return 0xfffffffffffffff0;
    }
    uVar2 = (zds->fParams).blockSizeMax;
    if (uVar2 < 5) {
      uVar2 = 4;
    }
    uVar23 = (ulong)uVar2;
    uVar22 = (zds->fParams).frameContentSize;
    uVar24 = 0x20000;
    if (uVar14 < 0x20000) {
      uVar24 = uVar14;
    }
    uVar14 = uVar14 + uVar24 + 0x40;
    if (uVar14 < uVar22) {
      uVar22 = uVar14;
    }
    uVar14 = uVar23 + uVar22;
    if (zds->outBuffSize + zds->inBuffSize < uVar14 * 3) {
      zds->oversizedDuration = 0;
    }
    else {
      zds->oversizedDuration = zds->oversizedDuration + 1;
    }
    bVar7 = true;
    if (((zds->inBuffSize < uVar23) || (zds->outBuffSize < uVar22)) ||
       (0x7f < zds->oversizedDuration)) {
      uVar24 = zds->staticSize;
      if (uVar24 == 0) {
        pcVar13 = zds->inBuff;
        if (pcVar13 != (char *)0x0) {
          p_Var5 = (zds->customMem).customFree;
          if (p_Var5 == (ZSTD_freeFunction)0x0) {
            free(pcVar13);
          }
          else {
            (*p_Var5)((zds->customMem).opaque,pcVar13);
          }
        }
        zds->inBuffSize = 0;
        zds->outBuffSize = 0;
        p_Var6 = (zds->customMem).customAlloc;
        if (p_Var6 == (ZSTD_allocFunction)0x0) {
          pcVar13 = (char *)malloc(uVar14);
        }
        else {
          pcVar13 = (char *)(*p_Var6)((zds->customMem).opaque,uVar14);
        }
        zds->inBuff = pcVar13;
        if (pcVar13 != (char *)0x0) goto LAB_0016422d;
      }
      else {
        if (uVar24 < 0x27218) {
          __assert_fail("zds->staticSize >= sizeof(ZSTD_DCtx)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6021,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        if (uVar14 <= uVar24 - 0x27218) {
LAB_0016422d:
          zds->inBuffSize = uVar23;
          zds->outBuff = zds->inBuff + uVar23;
          zds->outBuffSize = uVar22;
          goto LAB_00164249;
        }
      }
      local_a0 = 0xffffffffffffffc0;
      bVar7 = false;
    }
LAB_00164249:
    if (!bVar7) {
      return local_a0;
    }
    zds->streamStage = zdss_read;
switchD_00163e09_caseD_2:
    uVar14 = (long)pvVar21 - (long)__src;
    ZVar3 = zds->stage;
    if ((ZVar3 - ZSTDds_decompressBlock < 2) && (zds->bType == bt_raw)) {
      sVar16 = uVar14 + (uVar14 == 0);
      if (zds->expected <= sVar16) {
        sVar16 = zds->expected;
      }
    }
    else {
      sVar16 = zds->expected;
    }
    if (sVar16 == 0) {
      ZVar10 = zdss_init;
      bVar8 = false;
LAB_001642b0:
      zds->streamStage = ZVar10;
      iVar9 = 4;
      sVar18 = local_a0;
    }
    else {
      iVar9 = 0;
      sVar18 = local_a0;
      if (sVar16 <= uVar14) {
        if (ZVar3 == ZSTDds_skipFrame) {
          sVar18 = 0;
        }
        else {
          sVar18 = zds->outBuffSize - zds->outStart;
        }
        sVar15 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar18,__src,sVar16);
        iVar9 = 1;
        sVar18 = sVar15;
        if ((sVar15 < 0xffffffffffffff89) &&
           ((__src = (void *)((long)__src + sVar16), ZVar3 == ZSTDds_skipFrame ||
            (iVar9 = 4, sVar18 = local_a0, sVar15 != 0)))) {
          zds->outEnd = zds->outStart + sVar15;
          ZVar10 = zdss_flush;
          goto LAB_001642b0;
        }
      }
    }
    local_a0 = sVar18;
    if (iVar9 != 4) {
      if (iVar9 != 0) {
        return local_a0;
      }
      if (__src == pvVar21) {
        bVar8 = false;
      }
      else {
        zds->streamStage = zdss_load;
LAB_0016436a:
        uVar14 = zds->expected;
        ZVar3 = zds->stage;
        uVar24 = (long)pvVar21 - (long)__src;
        uVar22 = uVar14;
        if (((ZVar3 - ZSTDds_decompressBlock < 2) && (zds->bType == bt_raw)) &&
           (uVar22 = uVar24 + (uVar24 == 0), uVar14 <= uVar22)) {
          uVar22 = uVar14;
        }
        if (uVar14 != uVar22) {
          __assert_fail("neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6052,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
        sVar16 = zds->inPos;
        uVar23 = uVar14 - sVar16;
        uVar22 = uVar23;
        if (ZVar3 == ZSTDds_skipFrame) {
          if (uVar24 <= uVar23) {
            uVar22 = uVar24;
          }
LAB_0016441f:
          zds->inPos = zds->inPos + uVar22;
          __src = (void *)((long)__src + uVar22);
          iVar9 = 4;
          if (uVar22 < uVar23) {
            bVar8 = false;
            iVar9 = 4;
          }
          else {
            sVar16 = ZSTD_decompressContinue
                               (zds,zds->outBuff + zds->outStart,zds->outBuffSize - zds->outStart,
                                zds->inBuff,uVar14);
            if (sVar16 < 0xffffffffffffff89) {
              zds->inPos = 0;
              if ((ZVar3 == ZSTDds_skipFrame) || (sVar16 != 0)) {
                zds->outEnd = zds->outStart + sVar16;
                iVar9 = 0;
              }
              else {
                zds->streamStage = zdss_read;
              }
            }
            else {
              iVar9 = 1;
              local_a0 = sVar16;
            }
          }
        }
        else {
          if (uVar23 <= zds->inBuffSize - sVar16) {
            if (uVar24 <= uVar23) {
              uVar22 = uVar24;
            }
            if (uVar22 != 0) {
              memcpy(zds->inBuff + sVar16,__src,uVar22);
            }
            goto LAB_0016441f;
          }
          local_a0 = 0xffffffffffffffec;
          iVar9 = 1;
        }
        if (iVar9 != 4) {
          if (iVar9 != 0) {
            return local_a0;
          }
          zds->streamStage = zdss_flush;
LAB_001644e4:
          uVar24 = zds->outEnd - zds->outStart;
          uVar22 = (long)pvVar20 - (long)local_88;
          uVar14 = uVar22;
          if (uVar24 <= uVar22) {
            uVar14 = uVar24;
          }
          if (uVar14 != 0) {
            memcpy(local_88,zds->outBuff + zds->outStart,uVar14);
          }
          local_88 = (void *)((long)local_88 + uVar14);
          sVar16 = *psVar1;
          *psVar1 = uVar14 + sVar16;
          if (uVar22 < uVar24) {
            bVar8 = false;
          }
          else {
            zds->streamStage = zdss_read;
            if ((zds->outBuffSize < (zds->fParams).frameContentSize) &&
               (zds->outBuffSize < uVar14 + sVar16 + (ulong)(zds->fParams).blockSizeMax)) {
              *psVar1 = 0;
              zds->outEnd = 0;
            }
          }
        }
      }
    }
  }
LAB_0016458e:
  if (!bVar8) {
    uVar17 = (long)__src - (long)input->src;
    input->pos = uVar17;
    output->pos = (long)local_88 - (long)output->dst;
    if ((__src == src_00) && (local_88 == pvVar19)) {
      iVar9 = zds->noForwardProgress;
      zds->noForwardProgress = iVar9 + 1;
      if (0xe < iVar9) {
        if (local_88 == pvVar20) {
          return 0xffffffffffffffba;
        }
        if (__src == pvVar21) {
          return 0xffffffffffffffb8;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x608c,
                      "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                     );
      }
    }
    else {
      zds->noForwardProgress = 0;
    }
    sVar16 = zds->expected;
    if (sVar16 == 0) {
      if (zds->outEnd != zds->outStart) {
        if (zds->hostageByte != 0) {
          return 1;
        }
        input->pos = uVar17 - 1;
        zds->hostageByte = 1;
        return 1;
      }
      if (zds->hostageByte != 0) {
        if (input->size <= uVar17) {
          zds->streamStage = zdss_read;
          return 1;
        }
        input->pos = uVar17 + 1;
      }
      return 0;
    }
    ZVar11 = ZSTD_nextInputType(zds);
    uVar17 = (ulong)(ZVar11 == ZSTDnit_block) * 3 + sVar16;
    if (zds->inPos <= uVar17) {
      return uVar17 - zds->inPos;
    }
    __assert_fail("zds->inPos <= nextSrcSizeHint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x60a5,
                  "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)")
    ;
  }
  goto LAB_00163de6;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
            zds->legacyVersion = 0;
            zds->hostageByte = 0;
            /* fall-through */

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                DEBUGLOG(5, "header size : %u", (U32)hSize);
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize));
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize && zds->fParams.windowSize /* skippable frame if == 0 */
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, iend-istart);
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, oend-op, istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    ip = istart + cSize;
                    op += decompressedSize;
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)));

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize));
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge);

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize);

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation);
                        } else {
                            ZSTD_free(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_malloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation);
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            /* fall-through */

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip);
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    int const isSkipFrame = ZSTD_isSkipFrame(zds);
                    size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, (isSkipFrame ? 0 : zds->outBuffSize - zds->outStart),
                        ip, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    ip += neededInSize;
                    if (!decodedSize && !isSkipFrame) break;   /* this was just a header */
                    zds->outEnd = zds->outStart + decodedSize;
                    zds->streamStage = zdss_flush;
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            /* fall-through */

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, iend - ip));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, iend-ip);
                }
                ip += loadedSize;
                zds->inPos += loadedSize;
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                {   size_t const decodedSize = ZSTD_decompressContinue(zds,
                        zds->outBuff + zds->outStart, zds->outBuffSize - zds->outStart,
                        zds->inBuff, neededInSize);
                    if (ZSTD_isError(decodedSize)) return decodedSize;
                    zds->inPos = 0;   /* input is consumed */
                    if (!decodedSize && !isSkipFrame) { zds->streamStage = zdss_read; break; }   /* this was just a header */
                    zds->outEnd = zds->outStart +  decodedSize;
            }   }
            zds->streamStage = zdss_flush;
            /* fall-through */

        case zdss_flush:
            {   size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, oend-op, zds->outBuff + zds->outStart, toFlushSize);
                op += flushedSize;
                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                      && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC);   /* some compiler require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));
    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, dstSize_tooSmall);
            RETURN_ERROR_IF(ip==iend, srcSize_wrong);
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}